

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit_writer_utils.h
# Opt level: O0

void VP8LPutBits(VP8LBitWriter *bw,uint32_t bits,int n_bits)

{
  int in_EDX;
  uint in_ESI;
  ulong *in_RDI;
  
  if (0 < in_EDX) {
    if (0x1f < (int)in_RDI[1]) {
      VP8LPutBitsFlushBits((VP8LBitWriter *)CONCAT44(in_ESI,in_EDX));
    }
    *in_RDI = (ulong)in_ESI << ((byte)(int)in_RDI[1] & 0x3f) | *in_RDI;
    *(int *)(in_RDI + 1) = in_EDX + (int)in_RDI[1];
  }
  return;
}

Assistant:

static WEBP_INLINE void VP8LPutBits(VP8LBitWriter* const bw,
                                    uint32_t bits, int n_bits) {
  if (sizeof(vp8l_wtype_t) == 4) {
    if (n_bits > 0) {
      if (bw->used_ >= 32) {
        VP8LPutBitsFlushBits(bw);
      }
      bw->bits_ |= (vp8l_atype_t)bits << bw->used_;
      bw->used_ += n_bits;
    }
  } else {
    VP8LPutBitsInternal(bw, bits, n_bits);
  }
}